

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O2

bool DecodeHexBlk(CBlock *block,string *strHexBlk)

{
  bool bVar1;
  long in_FS_OFFSET;
  string_view hex_str;
  Span<const_std::byte> sp;
  string_view str;
  DataStream ssBlock;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blockData;
  ParamsWrapper<TransactionSerParams,_CBlock> local_60;
  DataStream local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (strHexBlk->_M_dataplus)._M_p;
  str._M_len = strHexBlk->_M_string_length;
  bVar1 = IsHex(str);
  if (bVar1) {
    hex_str._M_str = (strHexBlk->_M_dataplus)._M_p;
    hex_str._M_len = strHexBlk->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,hex_str);
    sp.m_size = (long)local_30._M_impl.super__Vector_impl_data._M_finish -
                (long)local_30._M_impl.super__Vector_impl_data._M_start;
    sp.m_data = local_30._M_impl.super__Vector_impl_data._M_start;
    DataStream::DataStream(&local_50,sp);
    local_60.m_params = &TX_WITH_WITNESS;
    local_60.m_object = block;
    ParamsWrapper<TransactionSerParams,_CBlock>::Unserialize<DataStream>(&local_60,&local_50);
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool DecodeHexBlk(CBlock& block, const std::string& strHexBlk)
{
    if (!IsHex(strHexBlk))
        return false;

    std::vector<unsigned char> blockData(ParseHex(strHexBlk));
    DataStream ssBlock(blockData);
    try {
        ssBlock >> TX_WITH_WITNESS(block);
    }
    catch (const std::exception&) {
        return false;
    }

    return true;
}